

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void fstat_cb(uv_fs_t *req)

{
  uv_stat_t *s;
  uv_fs_t *req_local;
  
  if (req->fs_type != UV_FS_FSTAT) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x150,"req->fs_type == UV_FS_FSTAT");
    abort();
  }
  if (req->result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x151,"req->result == 0");
    abort();
  }
  if (*(long *)((long)req->ptr + 0x38) != 0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x152,"s->st_size == sizeof(test_buf)");
    abort();
  }
  uv_fs_req_cleanup(req);
  fstat_cb_count = fstat_cb_count + 1;
  return;
}

Assistant:

static void fstat_cb(uv_fs_t* req) {
  uv_stat_t* s = req->ptr;
  ASSERT(req->fs_type == UV_FS_FSTAT);
  ASSERT(req->result == 0);
  ASSERT(s->st_size == sizeof(test_buf));
  uv_fs_req_cleanup(req);
  fstat_cb_count++;
}